

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void j2k_read_float32_to_float(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  long lVar1;
  OPJ_FLOAT32 l_temp;
  OPJ_FLOAT32 local_2c;
  
  if (p_nb_elem != 0) {
    lVar1 = 0;
    do {
      opj_read_float_LE((OPJ_BYTE *)p_src_data,&local_2c);
      p_src_data = (void *)((long)p_src_data + 4);
      *(OPJ_FLOAT32 *)((long)p_dest_data + lVar1 * 4) = local_2c;
      lVar1 = lVar1 + 1;
    } while (p_nb_elem != (OPJ_UINT32)lVar1);
  }
  return;
}

Assistant:

void  j2k_read_float32_to_float (const void * p_src_data, void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
	OPJ_BYTE * l_src_data = (OPJ_BYTE *) p_src_data;
	OPJ_FLOAT32 * l_dest_data = (OPJ_FLOAT32 *) p_dest_data;
	OPJ_UINT32 i;
	OPJ_FLOAT32 l_temp;

	for (i=0;i<p_nb_elem;++i) {
		opj_read_float(l_src_data,&l_temp);

		l_src_data+=sizeof(OPJ_FLOAT32);

		*(l_dest_data++) = l_temp;
	}
}